

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

Status __thiscall
soplex::SLUFactor<double>::change
          (SLUFactor<double> *this,int idx,SVectorBase<double> *subst,SSVectorBase<double> *e)

{
  Status SVar1;
  double *pdVar2;
  CLUFactor<double> *this_00;
  SSVectorBase<double> *in_RCX;
  undefined4 in_ESI;
  SLUFactor<double> *in_RDI;
  int fsize;
  int *in_stack_00000120;
  int in_stack_0000012c;
  double *in_stack_00000130;
  int in_stack_0000013c;
  CLUFactor<double> *in_stack_00000140;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  SSVectorBase<double> *in_stack_ffffffffffffff60;
  CLUFactor<double> *pCVar3;
  CLUFactor<double> *in_stack_ffffffffffffff70;
  SVectorBase<double> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  CLUFactor<double> *in_stack_ffffffffffffffd0;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if ((in_RDI->usetup & 1U) == 0) {
    if (in_RCX == (SSVectorBase<double> *)0x0) {
      if ((in_RDI->super_CLUFactor<double>).l.updateType == 1) {
        SSVectorBase<double>::operator=
                  (in_stack_ffffffffffffff60,
                   (SVectorBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        SSVectorBase<double>::altValues(in_stack_ffffffffffffff60);
        CLUFactor<double>::solveLright(in_stack_ffffffffffffffd0,(double *)in_RDI);
        SSVectorBase<double>::altValues(in_stack_ffffffffffffff60);
        CLUFactor<double>::forestUpdate
                  (in_stack_00000140,in_stack_0000013c,in_stack_00000130,in_stack_0000012c,
                   in_stack_00000120);
        SSVectorBase<double>::setSize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        SSVectorBase<double>::forceSetup(&in_RDI->forest);
      }
      else {
        VectorBase<double>::operator=
                  ((VectorBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        SSVectorBase<double>::clear(in_stack_ffffffffffffff60);
        pCVar3 = &in_RDI->super_CLUFactor<double>;
        pdVar2 = SSVectorBase<double>::altValues((SSVectorBase<double> *)pCVar3);
        VectorBase<double>::get_ptr((VectorBase<double> *)0x287e72);
        CLUFactor<double>::solveRight(in_stack_ffffffffffffff70,pdVar2,(double *)pCVar3);
        changeEta((SLUFactor<double> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                  ,iVar4,(SSVectorBase<double> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
    }
    else {
      (in_RDI->super_CLUFactor<double>).l.updateType = 0;
      pCVar3 = &in_RDI->super_CLUFactor<double>;
      pdVar2 = SSVectorBase<double>::values((SSVectorBase<double> *)0x287d02);
      iVar4 = (int)((ulong)pdVar2 >> 0x20);
      this_00 = (CLUFactor<double> *)SSVectorBase<double>::indexMem(in_RCX);
      SSVectorBase<double>::size((SSVectorBase<double> *)0x287d26);
      CLUFactor<double>::updateNoClear
                (this_00,iVar4,(double *)CONCAT44(in_ESI,in_stack_ffffffffffffff90),(int *)pCVar3,
                 in_stack_ffffffffffffff84);
      (in_RDI->super_CLUFactor<double>).l.updateType = in_RDI->uptype;
    }
  }
  else if ((in_RDI->super_CLUFactor<double>).l.updateType == 1) {
    SSVectorBase<double>::size((SSVectorBase<double> *)0x287c13);
    SSVectorBase<double>::altValues(in_stack_ffffffffffffff60);
    SSVectorBase<double>::altIndexMem(in_stack_ffffffffffffff60);
    CLUFactor<double>::forestUpdate
              (in_stack_00000140,in_stack_0000013c,in_stack_00000130,in_stack_0000012c,
               in_stack_00000120);
    SSVectorBase<double>::setSize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    SSVectorBase<double>::forceSetup(&in_RDI->forest);
  }
  else {
    changeEta((SLUFactor<double> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
              iVar4,(SSVectorBase<double> *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  in_RDI->usetup = false;
  (*(in_RDI->super_SLinSolver<double>)._vptr_SLinSolver[6])();
  SPxOut::debug<soplex::SLUFactor<double>,_const_char_(&)[34],_double,_0>
            (in_RDI,(char (*) [34])"DSLUFA01\tupdated\t\tstability = {}\n",
             (double *)&stack0xffffffffffffffd0);
  SVar1 = (*(in_RDI->super_SLinSolver<double>)._vptr_SLinSolver[1])();
  return SVar1;
}

Assistant:

typename SLUFactor<R>::Status SLUFactor<R>::change(
   int             idx,
   const SVectorBase<R>&  subst,
   const SSVectorBase<R>* e)
{

   // BH 2005-08-23: The boolean usetup indicates that an "update VectorBase<R>"
   // has been set up. I suppose that SSVectorBase<R>  forest is this
   // update VectorBase<R>, which is set up by solveRight4update() and
   // solve2right4update() in order to optimize the basis update.

   if(usetup)
   {
      if(this->l.updateType == FOREST_TOMLIN)               // FOREST_TOMLIN updates
      {
         // BH 2005-08-19: The size of a SSVectorBase<R>  is the size of the
         // index set, i.e.  the number of nonzeros which is only
         // defined if the SSVectorBase<R>  is set up.  Since
         // SSVectorBase<R> ::altValues() calls unSetup() the size needs to be
         // stored before the following call.
         int fsize = forest.size(); // see altValues()
         this->forestUpdate(idx, forest.altValues(), fsize, forest.altIndexMem());
         forest.setSize(0);
         forest.forceSetup();
      }
      else
      {
         assert(this->l.updateType == ETA);
         changeEta(idx, eta);
      }
   }
   else if(e != nullptr)                                    // ETA updates
   {
      this->l.updateType = ETA;
      this->updateNoClear(idx, e->values(), e->indexMem(), e->size());
      this->l.updateType = uptype;
   }
   else if(this->l.updateType == FOREST_TOMLIN)             // FOREST_TOMLIN updates
   {
      assert(0);  // probably this part is never called.
      // forestUpdate() with the last parameter set to NULL should fail.
      forest = subst;
      CLUFactor<R>::solveLright(forest.altValues());
      this->forestUpdate(idx, forest.altValues(), 0, nullptr);
      forest.setSize(0);
      forest.forceSetup();
   }
   else                                               // ETA updates
   {
      assert(this->l.updateType == ETA);
      vec = subst;
      eta.clear();
      CLUFactor<R>::solveRight(eta.altValues(), vec.get_ptr());
      changeEta(idx, eta);
   }

   usetup = false;

   SPxOut::debug(this, "DSLUFA01\tupdated\t\tstability = {}\n", stability());

   return status();
}